

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O2

int uv_poll_start(uv_poll_t *handle,int pevents,uv_poll_cb poll_cb)

{
  uint *puVar1;
  uint uVar2;
  char *__assertion;
  
  if ((uint)pevents < 0x10) {
    if ((handle->flags & 3) == 0) {
      uv__poll_stop(handle);
      if (pevents != 0) {
        uVar2 = (pevents & 1U) + 2;
        if ((uint)pevents < 8) {
          uVar2 = pevents & 1U;
        }
        uv__io_start(handle->loop,&handle->io_watcher,
                     (pevents & 4U) * 0x800 + (pevents & 2U) * 2 | uVar2);
        uVar2 = handle->flags;
        if (((uVar2 & 4) == 0) && (handle->flags = uVar2 | 4, (uVar2 & 8) != 0)) {
          puVar1 = &handle->loop->active_handles;
          *puVar1 = *puVar1 + 1;
        }
        handle->poll_cb = poll_cb;
      }
      return 0;
    }
    __assertion = "!uv__is_closing(handle)";
    uVar2 = 0x7b;
  }
  else {
    __assertion = "(pevents & ~(UV_READABLE | UV_WRITABLE | UV_DISCONNECT | UV_PRIORITIZED)) == 0";
    uVar2 = 0x7a;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/poll.c"
                ,uVar2,"int uv_poll_start(uv_poll_t *, int, uv_poll_cb)");
}

Assistant:

int uv_poll_start(uv_poll_t* handle, int pevents, uv_poll_cb poll_cb) {
  int events;

  assert((pevents & ~(UV_READABLE | UV_WRITABLE | UV_DISCONNECT |
                      UV_PRIORITIZED)) == 0);
  assert(!uv__is_closing(handle));

  uv__poll_stop(handle);

  if (pevents == 0)
    return 0;

  events = 0;
  if (pevents & UV_READABLE)
    events |= POLLIN;
  if (pevents & UV_PRIORITIZED)
    events |= UV__POLLPRI;
  if (pevents & UV_WRITABLE)
    events |= POLLOUT;
  if (pevents & UV_DISCONNECT)
    events |= UV__POLLRDHUP;

  uv__io_start(handle->loop, &handle->io_watcher, events);
  uv__handle_start(handle);
  handle->poll_cb = poll_cb;

  return 0;
}